

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_utilities.cpp
# Opt level: O3

void ShaderUtilities::attach_dir_light(GLuint p_shader_id,DirectionalLight *directional_light)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  GLint GVar3;
  undefined8 local_68;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_60;
  long *local_58 [2];
  long local_48 [2];
  GLfloat local_34;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"material.shininess","");
  p_Var1 = glad_glUniform1f;
  local_34 = directional_light->m_shininess;
  GVar3 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_58[0]);
  (*p_Var1)(GVar3,local_34);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"directional_light.direction","");
  p_Var2 = glad_glUniform3fv;
  GVar3 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_58[0]);
  (*p_Var2)(GVar3,1,(GLfloat *)&directional_light->m_direction);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"directional_light.ambient","")
  ;
  p_Var2 = glad_glUniform3fv;
  if (LightingDbWindow::enable_dir_light == '\x01') {
    local_60 = (directional_light->m_phong).m_ambient.field_2;
    local_68._0_4_ = (directional_light->m_phong).m_ambient.field_0;
    local_68._4_4_ = (directional_light->m_phong).m_ambient.field_1;
  }
  else {
    local_68 = 0;
    local_60.z = 0.0;
  }
  GVar3 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_58[0]);
  (*p_Var2)(GVar3,1,(GLfloat *)&local_68);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"directional_light.diffuse","")
  ;
  p_Var2 = glad_glUniform3fv;
  if (LightingDbWindow::enable_dir_light == '\x01') {
    local_60 = (directional_light->m_phong).m_diffuse.field_2;
    local_68._0_4_ = (directional_light->m_phong).m_diffuse.field_0;
    local_68._4_4_ = (directional_light->m_phong).m_diffuse.field_1;
  }
  else {
    local_68 = 0;
    local_60.z = 0.0;
  }
  GVar3 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_58[0]);
  (*p_Var2)(GVar3,1,(GLfloat *)&local_68);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"directional_light.specular","");
  p_Var2 = glad_glUniform3fv;
  if (LightingDbWindow::enable_dir_light == '\x01') {
    local_60 = (directional_light->m_phong).m_specular.field_2;
    local_68._0_4_ = (directional_light->m_phong).m_specular.field_0;
    local_68._4_4_ = (directional_light->m_phong).m_specular.field_1;
  }
  else {
    local_68 = 0;
    local_60.z = 0.0;
  }
  GVar3 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_58[0]);
  (*p_Var2)(GVar3,1,(GLfloat *)&local_68);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void ShaderUtilities::attach_dir_light(
    const GLuint p_shader_id,
    const DirectionalLight &directional_light) noexcept
{
    // TODO :: Shininess is actually part of Directional Light, as such, we need a separate Material helper class
    setFloat(
        p_shader_id,
        "material.shininess",
        directional_light.m_shininess);
    setVec3(
        p_shader_id,
        "directional_light.direction",
        directional_light.m_direction);
    setVec3(
        p_shader_id,
        "directional_light.ambient",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_ambient
                                           : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "directional_light.diffuse",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_diffuse
                                           : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "directional_light.specular",
        LightingDbWindow::enable_dir_light ? directional_light.m_phong.m_specular
                                           : glm::vec3(0.0f));
}